

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

int __kmp_api_omp_get_num_teams_(void)

{
  int iVar1;
  kmp_info_t *pkVar2;
  int level;
  int dd;
  int ii;
  int tlevel;
  kmp_team_t *team;
  kmp_info_t *thr;
  int local_24;
  int local_20;
  kmp_team_p *local_18;
  int local_4;
  
  pkVar2 = __kmp_entry_thread();
  if ((pkVar2->th).th_teams_microtask == (microtask_t)0x0) {
    local_4 = 1;
  }
  else {
    local_18 = (pkVar2->th).th_team;
    local_20 = (local_18->t).t_level;
    local_24 = (local_18->t).t_serialized;
    iVar1 = (pkVar2->th).th_teams_level + 1;
    while (iVar1 < local_20) {
      for (local_24 = (local_18->t).t_serialized; 0 < local_24 && iVar1 < local_20;
          local_24 = local_24 + -1) {
        local_20 = local_20 + -1;
      }
      if (((local_18->t).t_serialized == 0) || (local_24 != 0)) {
        if (iVar1 < local_20) {
          local_18 = (local_18->t).t_parent;
          local_20 = local_20 + -1;
        }
      }
      else {
        local_18 = (local_18->t).t_parent;
      }
    }
    if (local_24 < 2) {
      local_4 = (((local_18->t).t_parent)->t).t_nproc;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_NUM_TEAMS)(void) {
#ifdef KMP_STUB
  return 1;
#else
  kmp_info_t *thr = __kmp_entry_thread();
  if (thr->th.th_teams_microtask) {
    kmp_team_t *team = thr->th.th_team;
    int tlevel = thr->th.th_teams_level;
    int ii = team->t.t_level; // the level of the teams construct
    int dd = team->t.t_serialized;
    int level = tlevel + 1;
    KMP_DEBUG_ASSERT(ii >= tlevel);
    while (ii > level) {
      for (dd = team->t.t_serialized; (dd > 0) && (ii > level); dd--, ii--) {
      }
      if (team->t.t_serialized && (!dd)) {
        team = team->t.t_parent;
        continue;
      }
      if (ii > level) {
        team = team->t.t_parent;
        ii--;
      }
    }
    if (dd > 1) {
      return 1; // teams region is serialized ( 1 team of 1 thread ).
    } else {
      return team->t.t_parent->t.t_nproc;
    }
  } else {
    return 1;
  }
#endif
}